

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec,Vec_Ptr_t *candVec)

{
  Vec_Int_t *pVVar1;
  int i;
  
  if (masterVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("masterVec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/disjunctiveMonotone.c"
                  ,0x23c,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (candVec != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < candVec->nSize; i = i + 1) {
      pVVar1 = (Vec_Int_t *)Vec_PtrEntry(candVec,i);
      pVVar1 = Vec_IntDup(pVVar1);
      Vec_PtrPush(masterVec,pVVar1);
    }
    return;
  }
  __assert_fail("candVec != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/disjunctiveMonotone.c"
                ,0x23d,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec, Vec_Ptr_t *candVec )
{
    int i;
    Vec_Int_t *vCand;
    Vec_Int_t *vNewIntVec;

    assert(masterVec != NULL);
    assert(candVec != NULL);
    Vec_PtrForEachEntry( Vec_Int_t *, candVec, vCand, i )
    {
        vNewIntVec = Vec_IntDup(vCand);    
        Vec_PtrPush(masterVec, vNewIntVec);
    }
}